

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

bool __thiscall FPolyObj::RotatePolyobj(FPolyObj *this,DAngle *angle,bool fromsave)

{
  undefined8 *puVar1;
  uint uVar2;
  undefined8 *puVar3;
  double *pdVar4;
  FPolyVertex *pFVar5;
  vertex_t **ppvVar6;
  double v;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined8 uVar10;
  double dVar11;
  double dVar12;
  FBoundingBox bounds;
  bool bVar13;
  FPolyObj *this_00;
  uint i_1;
  long lVar14;
  byte bVar15;
  uint i;
  ulong uVar16;
  FBoundingBox oldbounds;
  FBoundingBox local_78;
  undefined1 local_50 [32];
  
  local_78.m_Box[0] = (this->Bounds).m_Box[0];
  local_78.m_Box[1] = (this->Bounds).m_Box[1];
  local_78.m_Box[2] = (this->Bounds).m_Box[2];
  local_78.m_Box[3] = (this->Bounds).m_Box[3];
  v = angle->Degrees + (this->Angle).Degrees;
  UnLinkPolyobj(this);
  lVar14 = 0;
  for (uVar16 = 0; uVar16 < (this->Vertices).Count; uVar16 = uVar16 + 1) {
    puVar3 = *(undefined8 **)((long)(this->Vertices).Array + lVar14);
    uVar10 = puVar3[1];
    puVar1 = (undefined8 *)((long)&(((this->PrevPts).Array)->pos).X + lVar14 * 2);
    *puVar1 = *puVar3;
    puVar1[1] = uVar10;
    pdVar4 = (double *)((long)&(((this->OriginalPts).Array)->pos).X + lVar14 * 2);
    dVar11 = *pdVar4;
    dVar12 = pdVar4[1];
    dVar7 = fastsindeg(v);
    dVar8 = fastcosdeg(v);
    dVar9 = (this->StartSpot).pos.Y;
    pdVar4 = *(double **)((long)(this->Vertices).Array + lVar14);
    *pdVar4 = (this->StartSpot).pos.X + (dVar8 * dVar11 - dVar12 * dVar7);
    pdVar4[1] = dVar9 + dVar8 * dVar12 + dVar11 * dVar7;
    lVar14 = lVar14 + 8;
  }
  this->validcount = this->validcount + 1;
  UpdateBBox(this);
  if (!fromsave) {
    bVar15 = 0;
    for (uVar16 = 0; uVar16 < (this->Sidedefs).Count; uVar16 = uVar16 + 1) {
      bVar13 = CheckMobjBlocking(this,(this->Sidedefs).Array[uVar16]);
      bVar15 = bVar15 | bVar13;
    }
    if (bVar15 != 0) {
      uVar2 = (this->Vertices).Count;
      pFVar5 = (this->PrevPts).Array;
      ppvVar6 = (this->Vertices).Array;
      for (lVar14 = 0; (ulong)uVar2 << 3 != lVar14; lVar14 = lVar14 + 8) {
        puVar3 = *(undefined8 **)((long)ppvVar6 + lVar14);
        puVar1 = (undefined8 *)((long)&(pFVar5->pos).X + lVar14 * 2);
        uVar10 = puVar1[1];
        *puVar3 = *puVar1;
        puVar3[1] = uVar10;
      }
      UpdateBBox(this);
      LinkPolyobj(this);
      return false;
    }
  }
  (this->Angle).Degrees = angle->Degrees + (this->Angle).Degrees;
  LinkPolyobj(this);
  ClearSubsectorLinks(this);
  this_00 = (FPolyObj *)local_50;
  FBoundingBox::operator|(&this->Bounds,&local_78);
  bounds.m_Box[1] = (double)local_50._8_8_;
  bounds.m_Box[0] = (double)local_50._0_8_;
  bounds.m_Box[2] = (double)local_50._16_8_;
  bounds.m_Box[3] = (double)local_50._24_8_;
  RecalcActorFloorCeil(this_00,bounds);
  return true;
}

Assistant:

bool FPolyObj::RotatePolyobj (DAngle angle, bool fromsave)
{
	DAngle an;
	bool blocked;
	FBoundingBox oldbounds = Bounds;

	an = Angle + angle;

	UnLinkPolyobj();

	for(unsigned i=0;i < Vertices.Size(); i++)
	{
		PrevPts[i].pos = Vertices[i]->fPos();
		FPolyVertex torot = OriginalPts[i];
		RotatePt(an, torot.pos, StartSpot.pos);
		Vertices[i]->set(torot.pos.X, torot.pos.Y);
	}
	blocked = false;
	validcount++;
	UpdateBBox();

	// If we are loading a savegame we do not really want to damage actors and be blocked by them. This can also cause crashes when trying to damage incompletely deserialized player pawns.
	if (!fromsave)
	{
		for (unsigned i = 0; i < Sidedefs.Size(); i++)
		{
			if (CheckMobjBlocking(Sidedefs[i]))
			{
				blocked = true;
			}
		}
		if (blocked)
		{
			for(unsigned i=0;i < Vertices.Size(); i++)
			{
				Vertices[i]->set(PrevPts[i].pos.X, PrevPts[i].pos.Y);
			}
			UpdateBBox();
			LinkPolyobj();
			return false;
		}
	}
	Angle += angle;
	LinkPolyobj();
	ClearSubsectorLinks();
	RecalcActorFloorCeil(Bounds | oldbounds);
	return true;
}